

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

cmLinkLineComputer * __thiscall
cmGlobalNinjaGenerator::CreateLinkLineComputer
          (cmGlobalNinjaGenerator *this,cmOutputConverter *outputConverter,cmStateDirectory *param_2
          )

{
  cmStateDirectory *outputConverter_00;
  cmNinjaLinkLineComputer *this_00;
  const_reference ppcVar1;
  cmStateSnapshot local_60;
  cmStateDirectory local_48;
  cmStateDirectory *local_20;
  cmStateDirectory *param_2_local;
  cmOutputConverter *outputConverter_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_20 = param_2;
  param_2_local = (cmStateDirectory *)outputConverter;
  outputConverter_local = (cmOutputConverter *)this;
  this_00 = (cmNinjaLinkLineComputer *)operator_new(0x48);
  outputConverter_00 = param_2_local;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  cmLocalGenerator::GetStateSnapshot(&local_60,*ppcVar1);
  cmStateSnapshot::GetDirectory(&local_48,&local_60);
  cmNinjaLinkLineComputer::cmNinjaLinkLineComputer
            (this_00,(cmOutputConverter *)outputConverter_00,&local_48,this);
  return &this_00->super_cmLinkLineComputer;
}

Assistant:

cmLinkLineComputer* cmGlobalNinjaGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter,
  cmStateDirectory const& /* stateDir */) const
{
  return new cmNinjaLinkLineComputer(
    outputConverter,
    this->LocalGenerators[0]->GetStateSnapshot().GetDirectory(), this);
}